

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O0

void __thiscall duckdb::Transformer::PivotEntryCheck(Transformer *this,string *type)

{
  bool bVar1;
  string *msg;
  undefined8 uVar2;
  pointer pPVar3;
  string *in_RSI;
  vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_true>
  *entries;
  Transformer *in_stack_ffffffffffffff18;
  vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_true>
  *in_stack_ffffffffffffff20;
  vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  *in_stack_ffffffffffffff30;
  undefined1 local_b0 [32];
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  msg = (string *)GetPivotEntries(in_stack_ffffffffffffff18);
  bVar1 = ::std::
          vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
          ::empty(in_stack_ffffffffffffff30);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_38,
               "PIVOT statements with pivot elements extracted from the data cannot be used in %ss.\nIn order to use PIVOT in a %s the PIVOT values must be manually specified, e.g.:\nPIVOT ... ON %s IN (val1, val2, ...)"
               ,&local_39);
    ::std::__cxx11::string::string(local_70,in_RSI);
    ::std::__cxx11::string::string(local_90,in_RSI);
    vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_true>
    ::operator[](in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
    ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                  *)in_stack_ffffffffffffff20);
    pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)in_stack_ffffffffffffff20);
    (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])(local_b0);
    ParserException::ParserException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((ParserException *)in_RSI,msg,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0);
    __cxa_throw(uVar2,&ParserException::typeinfo,ParserException::~ParserException);
  }
  return;
}

Assistant:

void Transformer::PivotEntryCheck(const string &type) {
	auto &entries = GetPivotEntries();
	if (!entries.empty()) {
		throw ParserException(
		    "PIVOT statements with pivot elements extracted from the data cannot be used in %ss.\nIn order to use "
		    "PIVOT in a %s the PIVOT values must be manually specified, e.g.:\nPIVOT ... ON %s IN (val1, val2, ...)",
		    type, type, entries[0]->column->ToString());
	}
}